

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void state_REP(Context *ctx)

{
  RegisterType regtype;
  Context *ctx_local;
  
  if (ctx->source_args[0].regtype != REG_TYPE_CONSTINT) {
    fail(ctx,"REP argument isn\'t constint register");
  }
  ctx->reps = ctx->reps + 1;
  if (ctx->max_reps < ctx->reps) {
    ctx->max_reps = ctx->reps;
  }
  return;
}

Assistant:

static void state_REP(Context *ctx)
{
    const RegisterType regtype = ctx->source_args[0].regtype;
    if (regtype != REG_TYPE_CONSTINT)
        fail(ctx, "REP argument isn't constint register");

    ctx->reps++;
    if (ctx->reps > ctx->max_reps)
        ctx->max_reps = ctx->reps;
}